

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undefined.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_UNDEFINED::ONotEqual(_Type_UNDEFINED *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->(in_RCX);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_00,(Type *)obj1);
  pOVar2 = Variable::operator->((Variable *)this);
  *(bool *)pOVar2->data = bVar1;
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_UNDEFINED::ONotEqual(const Variable &obj1, const Variable &obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    res->GetData<bool>() = (obj2->GetType() != *this);
    return res;
}